

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBreakCommand.cxx
# Opt level: O2

bool __thiscall
cmBreakCommand::InitialPass
          (cmBreakCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar6;
  string sStack_1c8;
  ostringstream e;
  
  bVar3 = cmMakefile::IsLoopBlock((this->super_cmCommand).Makefile);
  if (bVar3) {
LAB_001eb816:
    status->BreakInvoked = true;
    bVar3 = true;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    MVar6 = AUTHOR_WARNING;
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0055,false);
    if (PVar4 - NEW < 3) {
      MVar6 = FATAL_ERROR;
      bVar2 = true;
LAB_001eb89f:
      std::operator<<((ostream *)&e,"The BREAK command does not accept any arguments.");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,MVar6,&sStack_1c8);
      std::__cxx11::string::~string((string *)&sStack_1c8);
      if (bVar2) goto LAB_001eb8dc;
    }
    else if (PVar4 != OLD) {
      bVar2 = false;
      if (PVar4 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1c8,(cmPolicies *)0x37,id_00);
        poVar5 = std::operator<<((ostream *)&e,(string *)&sStack_1c8);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&sStack_1c8);
        bVar2 = false;
        MVar6 = AUTHOR_WARNING;
      }
      goto LAB_001eb89f;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    MVar6 = AUTHOR_WARNING;
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0055,false);
    if (2 < PVar4 - NEW) {
      if (PVar4 != OLD) {
        bVar3 = false;
        if (PVar4 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1c8,(cmPolicies *)0x37,id);
          poVar5 = std::operator<<((ostream *)&e,(string *)&sStack_1c8);
          std::operator<<(poVar5,"\n");
          std::__cxx11::string::~string((string *)&sStack_1c8);
          bVar3 = false;
          MVar6 = AUTHOR_WARNING;
        }
        goto LAB_001eb7cc;
      }
LAB_001eb80c:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      goto LAB_001eb816;
    }
    MVar6 = FATAL_ERROR;
    bVar3 = true;
LAB_001eb7cc:
    std::operator<<((ostream *)&e,
                    "A BREAK command was found outside of a proper FOREACH or WHILE loop scope.");
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,MVar6,&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    if (!bVar3) goto LAB_001eb80c;
LAB_001eb8dc:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmBreakCommand::InitialPass(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  if (!this->Makefile->IsLoopBlock()) {
    bool issueMessage = true;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0055)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "A BREAK command was found outside of a proper "
           "FOREACH or WHILE loop scope.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  status.SetBreakInvoked();

  if (!args.empty()) {
    bool issueMessage = true;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0055)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "The BREAK command does not accept any arguments.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  return true;
}